

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O1

iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
burst::algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>::
active_search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          match_candidate,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_current,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_end,bitmask_type *hint)

{
  ulong uVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  uint uVar4;
  uint uVar5;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar6;
  
  uVar1 = *(long *)(*(long *)this + 0x800) - 1;
  uVar4 = 0;
  if (uVar1 < 0x20) {
    uVar4 = (uint)(1L << ((byte)uVar1 & 0x3f));
  }
  _Var3._M_current = match_candidate._M_current;
  if (corpus_current._M_current != corpus_end._M_current) {
    pcVar2 = match_candidate._M_current +
             ((long)corpus_end._M_current - (long)corpus_current._M_current);
    do {
      uVar5 = (uint)(hint->super__Base_bitset<1UL>)._M_w;
      _Var3._M_current = match_candidate._M_current;
      if ((uVar5 & uVar4) != 0) break;
      (hint->super__Base_bitset<1UL>)._M_w =
           (ulong)(uVar5 * 2 + 1 &
                  *(uint *)(*(long *)this + (ulong)(byte)*corpus_current._M_current * 8));
      corpus_current._M_current = corpus_current._M_current + 1;
      match_candidate._M_current = match_candidate._M_current + 1;
      _Var3._M_current = pcVar2;
    } while (corpus_current._M_current != corpus_end._M_current);
  }
  if (((uint)(hint->super__Base_bitset<1UL>)._M_w & uVar4) == 0) {
    corpus_current._M_current = corpus_end._M_current;
    _Var3._M_current = corpus_end._M_current;
  }
  iVar6.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = corpus_current._M_current;
  iVar6.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = _Var3._M_current;
  return (iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )iVar6.
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  ;
}

Assistant:

boost::iterator_range<ForwardIterator>
                active_search
                (
                    ForwardIterator match_candidate,
                    ForwardIterator corpus_current,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                // Индикатор совпадения — единица на N-м месте в битовой маске,
                // где N — количество элементов в искомом образце.
                const auto match_indicator =
                    left_shift(bitmask_type{0b1}, m_bitmask_table->length() - 1u);
                auto & match_column = hint;

                while (corpus_current != corpus_end && (match_column & match_indicator) == 0)
                {
                    match_column = bit_shift(match_column) & (*m_bitmask_table)[*corpus_current];
                    ++corpus_current;
                    ++match_candidate;
                }

                return (match_column & match_indicator) == 0
                    ? boost::make_iterator_range(corpus_end, corpus_end)
                    : boost::make_iterator_range(match_candidate, corpus_current);
            }